

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderFailIfExtraTestissue107::runTestCase(TestCharReaderFailIfExtraTestissue107 *this)

{
  TestResult *pTVar1;
  int iVar2;
  Int actual;
  Value *this_00;
  CharReader *pCVar3;
  char doc [6];
  string errs;
  Value root;
  CharReaderBuilder b;
  undefined4 local_118;
  undefined2 local_114;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  string local_f0;
  string local_d0;
  Value local_b0;
  CharReaderBuilder local_88;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_88);
  Json::Value::Value(&local_b0,nullValue);
  local_114 = 0x33;
  local_118 = 0x3a323a31;
  Json::Value::Value(&local_58,true);
  this_00 = Json::Value::operator[](&local_88.settings_,"failIfExtra");
  Json::Value::operator=(this_00,&local_58);
  Json::Value::~Value(&local_58);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_88);
  local_108 = 0;
  local_100[0] = 0;
  local_110 = local_100;
  iVar2 = (*pCVar3->_vptr_CharReader[2])
                    (pCVar3,&local_118,(long)&local_114 + 1,&local_b0,&local_110);
  if ((char)iVar2 != '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7b4,"!ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"* Line 1, Column 2\n  Extra non-whitespace after JSON value.\n",""
            );
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_110,local_110 + local_108);
  JsonTest::checkStringEqual
            (pTVar1,&local_d0,&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7b8,
             "\"* Line 1, Column 2\\n\" \"  Extra non-whitespace after JSON value.\\n\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  actual = Json::Value::asInt(&local_b0);
  JsonTest::checkEqual<int,int>
            (pTVar1,1,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7b9,"1 == root.asInt()");
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  Json::Value::~Value(&local_b0);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_88);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, issue107) {
  // This is interpretted as an int value followed by a colon.
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "1:2:3";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(
      "* Line 1, Column 2\n"
      "  Extra non-whitespace after JSON value.\n",
      errs);
  JSONTEST_ASSERT_EQUAL(1, root.asInt());
  delete reader;
}